

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O3

xmlRMutexPtr xmlNewRMutex(void)

{
  pthread_mutex_t *__mutex;
  
  __mutex = (pthread_mutex_t *)malloc(0x68);
  if (__mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
    __mutex[1].__align = 0;
    pthread_cond_init((pthread_cond_t *)((long)__mutex + 0x38),(pthread_condattr_t *)0x0);
  }
  return (xmlRMutexPtr)__mutex;
}

Assistant:

xmlRMutexPtr
xmlNewRMutex(void)
{
    xmlRMutexPtr tok;

    tok = malloc(sizeof(xmlRMutex));
    if (tok == NULL)
        return (NULL);
    xmlInitRMutex(tok);
    return (tok);
}